

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::constraineddelaunay(tetgenmesh *this,clock_t *tv)

{
  memorypool *pmVar1;
  void **ppvVar2;
  arraypool *paVar3;
  char *pcVar4;
  long lVar5;
  unsigned_long uVar6;
  char *pcVar7;
  void *pvVar8;
  clock_t cVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  
  if (this->b->quiet == 0) {
    puts("Constrained Delaunay...");
  }
  makesegmentendpointsmap(this);
  makefacetverticesmap(this);
  if (this->b->verbose != 0) {
    puts("  Delaunizing segments.");
  }
  this->checksubsegflag = 1;
  pmVar1 = this->subsegs;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  if (0 < this->subsegs->items) {
    lVar16 = 0;
    do {
      lVar16 = lVar16 + 1;
      uVar6 = randomnation(this,(uint)lVar16);
      paVar3 = this->subsegstack;
      pcVar7 = arraypool::getblock(paVar3,(int)paVar3->objects);
      lVar12 = (long)paVar3->objectbytes * ((long)paVar3->objectsperblock - 1U & paVar3->objects);
      paVar3->objects = paVar3->objects + 1;
      paVar3 = this->subsegstack;
      uVar14 = (uint)uVar6;
      pcVar4 = paVar3->toparray[(int)uVar14 >> ((byte)paVar3->log2objectsperblock & 0x1f)];
      lVar10 = (long)paVar3->objectbytes * (long)(int)(paVar3->objectsperblockmark & uVar14);
      *(undefined8 *)(pcVar7 + lVar12) = *(undefined8 *)(pcVar4 + lVar10);
      *(undefined4 *)(pcVar7 + lVar12 + 8) = *(undefined4 *)(pcVar4 + lVar10 + 8);
      pmVar1 = this->subsegs;
      do {
        pvVar8 = memorypool::traverse(pmVar1);
        if (pvVar8 == (void *)0x0) {
          pvVar8 = (void *)0x0;
          break;
        }
      } while (*(long *)((long)pvVar8 + 0x18) == 0);
      paVar3 = this->subsegstack;
      pcVar4 = paVar3->toparray[(int)uVar14 >> ((byte)paVar3->log2objectsperblock & 0x1f)];
      lVar10 = (long)paVar3->objectbytes * (long)(int)(uVar14 & paVar3->objectsperblockmark);
      *(void **)(pcVar4 + lVar10) = pvVar8;
      pcVar4 = pcVar4 + lVar10 + 8;
      pcVar4[0] = '\0';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
    } while (lVar16 < this->subsegs->items);
  }
  delaunizesegments(this);
  if (this->b->verbose != 0) {
    printf("  Inserted %ld Steiner points.\n",this->st_segref_count);
  }
  cVar9 = clock();
  *tv = cVar9;
  if (this->b->verbose != 0) {
    puts("  Constraining facets.");
  }
  this->checksubfaceflag = 1;
  lVar16 = this->fillregioncount;
  lVar10 = this->cavitycount;
  lVar12 = this->cavityexpcount;
  lVar5 = this->st_segref_count;
  pmVar1 = this->subfaces;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  if (0 < this->subfaces->items) {
    lVar15 = 0;
    do {
      lVar15 = lVar15 + 1;
      uVar6 = randomnation(this,(uint)lVar15);
      paVar3 = this->subfacstack;
      pcVar7 = arraypool::getblock(paVar3,(int)paVar3->objects);
      lVar13 = (long)paVar3->objectbytes * ((long)paVar3->objectsperblock - 1U & paVar3->objects);
      paVar3->objects = paVar3->objects + 1;
      paVar3 = this->subfacstack;
      uVar14 = (uint)uVar6;
      pcVar4 = paVar3->toparray[(int)uVar14 >> ((byte)paVar3->log2objectsperblock & 0x1f)];
      lVar11 = (long)paVar3->objectbytes * (long)(int)(paVar3->objectsperblockmark & uVar14);
      *(undefined8 *)(pcVar7 + lVar13) = *(undefined8 *)(pcVar4 + lVar11);
      *(undefined4 *)(pcVar7 + lVar13 + 8) = *(undefined4 *)(pcVar4 + lVar11 + 8);
      pmVar1 = this->subfaces;
      do {
        pvVar8 = memorypool::traverse(pmVar1);
        if (pvVar8 == (void *)0x0) {
          pvVar8 = (void *)0x0;
          break;
        }
      } while (*(long *)((long)pvVar8 + 0x18) == 0);
      paVar3 = this->subfacstack;
      pcVar4 = paVar3->toparray[(int)uVar14 >> ((byte)paVar3->log2objectsperblock & 0x1f)];
      lVar11 = (long)paVar3->objectbytes * (long)(int)(uVar14 & paVar3->objectsperblockmark);
      *(void **)(pcVar4 + lVar11) = pvVar8;
      pcVar4 = pcVar4 + lVar11 + 8;
      pcVar4[0] = '\0';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
    } while (lVar15 < this->subfaces->items);
  }
  constrainedfacets(this);
  if (this->b->verbose != 0) {
    if (lVar16 < this->fillregioncount) {
      printf("  Remeshed %ld regions.\n");
    }
    if (lVar10 < this->cavitycount) {
      printf("  Remeshed %ld cavities");
      if (this->cavityexpcount != lVar12) {
        printf(" (%ld enlarged)");
      }
      puts(".");
    }
    if (0 < (this->st_segref_count - lVar5) + this->st_facref_count) {
      printf("  Inserted %ld (%ld, %ld) refine points.\n");
      return;
    }
  }
  return;
}

Assistant:

void tetgenmesh::constraineddelaunay(clock_t& tv)
{
  face searchsh, *parysh;
  face searchseg, *paryseg;
  int s, i;

  // Statistics.
  long bakfillregioncount;
  long bakcavitycount, bakcavityexpcount;
  long bakseg_ref_count;

  if (!b->quiet) {
    printf("Constrained Delaunay...\n");
  }

  makesegmentendpointsmap();
  makefacetverticesmap();

  if (b->verbose) {
    printf("  Delaunizing segments.\n");
  }

  checksubsegflag = 1;

  // Put all segments into the list (in random order).
  subsegs->traversalinit();
  for (i = 0; i < subsegs->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th seg to the i-th.
    subsegstack->newindex((void **) &paryseg);
    *paryseg = * (face *) fastlookup(subsegstack, s);
    // Put i-th seg to be the s-th.
    searchseg.sh = shellfacetraverse(subsegs);
    //sinfect(searchseg);  // Only save it once.
    paryseg = (face *) fastlookup(subsegstack, s);
    *paryseg = searchseg;
  }

  // Recover non-Delaunay segments.
  delaunizesegments();

  if (b->verbose) {
    printf("  Inserted %ld Steiner points.\n", st_segref_count); 
  }

  tv = clock();

  if (b->verbose) {
    printf("  Constraining facets.\n");
  }

  // Subfaces will be introduced.
  checksubfaceflag = 1;

  bakfillregioncount = fillregioncount;
  bakcavitycount = cavitycount;
  bakcavityexpcount = cavityexpcount;
  bakseg_ref_count = st_segref_count;

  // Randomly order the subfaces.
  subfaces->traversalinit();
  for (i = 0; i < subfaces->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th subface to the i-th.
    subfacstack->newindex((void **) &parysh);
    *parysh = * (face *) fastlookup(subfacstack, s);
    // Put i-th subface to be the s-th.
    searchsh.sh = shellfacetraverse(subfaces);
    parysh = (face *) fastlookup(subfacstack, s);
    *parysh = searchsh;
  }

  // Recover facets.
  constrainedfacets();

  if (b->verbose) {
    if (fillregioncount > bakfillregioncount) {
      printf("  Remeshed %ld regions.\n", fillregioncount-bakfillregioncount);
    }
    if (cavitycount > bakcavitycount) {
      printf("  Remeshed %ld cavities", cavitycount - bakcavitycount);
      if (cavityexpcount - bakcavityexpcount) {
        printf(" (%ld enlarged)", cavityexpcount - bakcavityexpcount);
      }
      printf(".\n");
    }
    if (st_segref_count + st_facref_count - bakseg_ref_count > 0) {
      printf("  Inserted %ld (%ld, %ld) refine points.\n", 
             st_segref_count + st_facref_count - bakseg_ref_count,
             st_segref_count - bakseg_ref_count, st_facref_count);
    }
  }
}